

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::OneofOptions::~OneofOptions(OneofOptions *this)

{
  OneofOptions *this_local;
  
  ~OneofOptions(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

OneofOptions::~OneofOptions() {
  // @@protoc_insertion_point(destructor:google.protobuf.OneofOptions)
  SharedDtor(*this);
}